

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

void __thiscall HEkkPrimal::updateDevex(HEkkPrimal *this)

{
  long lVar1;
  int iVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  bool bVar7;
  undefined8 in_RAX;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  HighsInt to_entry;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x4d,0);
  bVar7 = HSimplexNla::sparseLoopStyle
                    (&this->ekk_instance_->simplex_nla_,(this->col_aq).count,this->num_row,&local_14
                    );
  if ((long)local_14 < 1) {
    dVar13 = 0.0;
  }
  else {
    dVar13 = 0.0;
    lVar9 = 0;
    do {
      if (bVar7) {
        iVar8 = (this->col_aq).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9];
      }
      else {
        iVar8 = (int)lVar9;
      }
      dVar12 = (double)(this->devex_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start
                       [(this->ekk_instance_->basis_).basicIndex_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar8]] *
               (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar8];
      dVar13 = dVar13 + dVar12 * dVar12;
      lVar9 = lVar9 + 1;
    } while (local_14 != lVar9);
  }
  iVar8 = this->variable_in;
  pdVar3 = (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->devex_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar4[iVar8];
  if (((double)iVar2 + dVar13) * 3.0 < pdVar3[iVar8]) {
    this->num_bad_devex_weight_ = this->num_bad_devex_weight_ + 1;
  }
  dVar12 = (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[this->row_out];
  dVar13 = ((double)iVar2 + dVar13) / (dVar12 * dVar12);
  lVar9 = (long)(this->row_ap).count;
  if (0 < lVar9) {
    piVar5 = (this->row_ap).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->row_ap).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      iVar2 = piVar5[lVar10];
      dVar12 = pdVar6[iVar2];
      dVar12 = (double)piVar4[iVar2] + dVar13 * dVar12 * dVar12;
      if (pdVar3[iVar2] <= dVar12 && dVar12 != pdVar3[iVar2]) {
        pdVar3[iVar2] = dVar12;
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  lVar9 = (long)(this->row_ep).count;
  if (0 < lVar9) {
    piVar5 = (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = this->num_col;
    lVar10 = 0;
    do {
      lVar11 = (long)piVar5[lVar10];
      lVar1 = iVar2 + lVar11;
      dVar12 = pdVar6[lVar11];
      dVar12 = (double)piVar4[lVar1] + dVar13 * dVar12 * dVar12;
      if (pdVar3[lVar1] <= dVar12 && dVar12 != pdVar3[lVar1]) {
        pdVar3[lVar1] = dVar12;
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  if (dVar13 <= 1.0) {
    dVar13 = 1.0;
  }
  pdVar3[this->variable_out] = dVar13;
  pdVar3[iVar8] = 1.0;
  this->num_devex_iterations_ = this->num_devex_iterations_ + 1;
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x4d,0);
  return;
}

Assistant:

void HEkkPrimal::updateDevex() {
  analysis->simplexTimerStart(DevexUpdateWeightClock);
  // Compute the pivot weight from the reference set
  double dPivotWeight = 0.0;
  HighsInt to_entry;
  const bool use_col_indices = ekk_instance_.simplex_nla_.sparseLoopStyle(
      col_aq.count, num_row, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iRow = use_col_indices ? col_aq.index[iEntry] : iEntry;
    HighsInt iCol = ekk_instance_.basis_.basicIndex_[iRow];
    double dAlpha = devex_index_[iCol] * col_aq.array[iRow];
    dPivotWeight += dAlpha * dAlpha;
  }
  dPivotWeight += devex_index_[variable_in] * 1.0;

  // Check if the saved weight is too large
  if (edge_weight_[variable_in] > kBadDevexWeightFactor * dPivotWeight)
    num_bad_devex_weight_++;

  // Update the devex weight for all
  double dPivot = col_aq.array[row_out];
  dPivotWeight /= (dPivot * dPivot);

  for (HighsInt iEl = 0; iEl < row_ap.count; iEl++) {
    HighsInt iCol = row_ap.index[iEl];
    double alpha = row_ap.array[iCol];
    double devex = dPivotWeight * alpha * alpha;
    devex += devex_index_[iCol] * 1.0;
    if (edge_weight_[iCol] < devex) {
      edge_weight_[iCol] = devex;
    }
  }
  for (HighsInt iEl = 0; iEl < row_ep.count; iEl++) {
    HighsInt iRow = row_ep.index[iEl];
    HighsInt iCol = iRow + num_col;
    double alpha = row_ep.array[iRow];
    double devex = dPivotWeight * alpha * alpha;
    devex += devex_index_[iCol] * 1.0;
    if (edge_weight_[iCol] < devex) {
      edge_weight_[iCol] = devex;
    }
  }
  // Update devex weight for the pivots
  edge_weight_[variable_out] = max(1.0, dPivotWeight);
  edge_weight_[variable_in] = 1.0;
  num_devex_iterations_++;
  analysis->simplexTimerStop(DevexUpdateWeightClock);
}